

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O1

void __thiscall dlib::drawable::set_pos(drawable *this,long x,long y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  drawable_window *this_00;
  long lVar5;
  long lVar6;
  rectangle old;
  rectangle local_58;
  rectangle local_38;
  
  rmutex::lock(this->m,1);
  local_58.l = (this->rect).l;
  local_58.t = (this->rect).t;
  local_58.r = (this->rect).r;
  local_58.b = (this->rect).b;
  lVar1 = (this->rect).b;
  lVar2 = (this->rect).t;
  lVar3 = (this->rect).r;
  lVar4 = (this->rect).l;
  lVar6 = (lVar3 - lVar4) + 1;
  if (lVar3 < lVar4 || lVar1 < lVar2) {
    lVar6 = 0;
  }
  lVar5 = (lVar1 - lVar2) + 1;
  if (lVar3 < lVar4 || lVar1 < lVar2) {
    lVar5 = 0;
  }
  (this->rect).t = y;
  (this->rect).l = x;
  (this->rect).r = lVar6 + x + -1;
  (this->rect).b = y + -1 + lVar5;
  this_00 = this->parent;
  rectangle::operator+(&this->rect,&local_58);
  base_window::invalidate_rectangle(&this_00->super_base_window,&local_38);
  rmutex::unlock(this->m,1);
  return;
}

Assistant:

virtual void set_pos (
            long x,
            long y
        )
        {
            m.lock();       
            rectangle old(rect);            

            const unsigned long width = rect.width();
            const unsigned long height = rect.height();
            rect.set_top(y);
            rect.set_left(x);
            rect.set_right(static_cast<long>(x+width)-1);
            rect.set_bottom(static_cast<long>(y+height)-1);
            
            parent.invalidate_rectangle(rect+old);
            m.unlock();
        }